

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx::create_pipeline
          (DeconvolutionDepthWise_x86_avx *this,Option *opt)

{
  uint uVar1;
  _func_int **pp_Var2;
  int *piVar3;
  void *__ptr;
  Allocator *pAVar4;
  undefined4 *puVar5;
  int _h;
  ulong uVar6;
  _func_int *p_Var7;
  long lVar8;
  undefined4 *puVar9;
  int _w;
  ulong uVar10;
  char cVar11;
  int iVar12;
  Mat local_c8;
  Mat local_78;
  
  p_Var7 = this->_vptr_DeconvolutionDepthWise_x86_avx[-3];
  uVar10 = (long)*(int *)(&this->field_0xd8 + (long)p_Var7) *
           (long)*(int *)(&this->field_0xd4 + (long)p_Var7);
  uVar1 = *(uint *)(&this->field_0x114 + (long)p_Var7);
  uVar6 = (long)*(int *)(&this->field_0x110 + (long)p_Var7) / (long)(int)uVar1;
  _w = (int)uVar10;
  uVar6 = (long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) / (long)_w;
  if ((uVar1 != *(uint *)(&this->field_0xd0 + (long)p_Var7)) ||
     ((int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
           (long)((int)*(uint *)(&this->field_0xd0 + (long)p_Var7) / (int)uVar1)) * uVar1 != uVar1))
  {
    create_group_ops(this,opt);
    if (opt->lightmode != true) {
      return 0;
    }
    p_Var7 = this->_vptr_DeconvolutionDepthWise_x86_avx[-3];
    piVar3 = *(int **)(&this->field_0x170 + (long)p_Var7);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (*(long **)(&this->field_0x188 + (long)p_Var7) == (long *)0x0) {
          if (*(void **)(&this->field_0x168 + (long)p_Var7) != (void *)0x0) {
            free(*(void **)(&this->field_0x168 + (long)p_Var7));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x188 + (long)p_Var7) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1a8 + (long)p_Var7) = 0;
    *(undefined8 *)(&this->field_0x174 + (long)p_Var7) = 0;
    *(undefined8 *)(&this->field_0x17c + (long)p_Var7) = 0;
    *(undefined8 *)(&this->field_0x168 + (long)p_Var7) = 0;
    *(undefined8 *)(&this->field_0x170 + (long)p_Var7) = 0;
    *(undefined8 *)(&this->field_0x190 + (long)p_Var7) = 0;
    *(undefined8 *)(&this->field_0x198 + (long)p_Var7) = 0;
    *(undefined4 *)(&this->field_0x1a0 + (long)p_Var7) = 0;
    return 0;
  }
  cVar11 = '\x01';
  if (opt->use_packing_layout == true) {
    cVar11 = '\b';
    if ((uVar1 & 7) != 0) {
      cVar11 = ((uVar1 & 3) == 0) * '\x03' + '\x01';
    }
  }
  local_c8.cstep = 0;
  local_c8.data = (Allocator *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_c8.elempack = 0;
  iVar12 = 0;
  local_c8.allocator = (Allocator *)local_c8.data;
  local_c8.dims = (int)local_c8.refcount;
  local_c8.w = local_c8.refcount._4_4_;
  local_c8._48_8_ = local_c8.elemsize;
  local_c8.c = local_c8.elempack;
  Mat::create(&local_c8,*(int *)(&this->field_0x194 + (long)p_Var7),4,(Allocator *)0x0);
  pp_Var2 = this->_vptr_DeconvolutionDepthWise_x86_avx;
  p_Var7 = pp_Var2[-3];
  _h = *(int *)(&this->field_0x114 + (long)p_Var7);
  if (0 < (int)((uVar1 - (int)uVar1 % _h) * (*(int *)(&this->field_0xd0 + (long)p_Var7) / _h))) {
    lVar8 = *(long *)(&this->field_0x168 + (long)p_Var7);
    puVar9 = (undefined4 *)((long)local_c8.data + uVar10 * 4 + -4);
    do {
      if (0 < _w) {
        uVar6 = 0;
        puVar5 = puVar9;
        do {
          *puVar5 = *(undefined4 *)(lVar8 + uVar6 * 4);
          uVar6 = uVar6 + 1;
          puVar5 = puVar5 + -1;
        } while ((uVar10 & 0xffffffff) != uVar6);
        p_Var7 = pp_Var2[-3];
      }
      iVar12 = iVar12 + 1;
      _h = *(int *)(&this->field_0x114 + (long)p_Var7);
      lVar8 = lVar8 + uVar10 * 4;
      puVar9 = puVar9 + uVar10;
    } while (iVar12 < (int)((uVar1 - (int)uVar1 % _h) *
                           (*(int *)(&this->field_0xd0 + (long)p_Var7) / _h)));
  }
  if (cVar11 == '\x01') {
    if (&this->weight_data_tm != &local_c8) {
      piVar3 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = (this->weight_data_tm).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          __ptr = (this->weight_data_tm).data;
          pAVar4 = (this->weight_data_tm).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            (*pAVar4->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_tm).data = local_c8.data;
      (this->weight_data_tm).refcount =
           (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
      (this->weight_data_tm).elemsize = local_c8.elemsize;
      (this->weight_data_tm).elempack = local_c8.elempack;
      (this->weight_data_tm).allocator = local_c8.allocator;
      (this->weight_data_tm).dims = local_c8.dims;
      (this->weight_data_tm).w = local_c8.w;
      (this->weight_data_tm).h = local_c8.h;
      (this->weight_data_tm).d = local_c8.d;
      (this->weight_data_tm).c = local_c8.c;
      (this->weight_data_tm).cstep = local_c8.cstep;
    }
    goto LAB_004353e8;
  }
  if (cVar11 == '\x04') {
    Mat::reshape(&local_78,&local_c8,_w,_h,(Allocator *)0x0);
    convert_packing(&local_78,&this->weight_data_tm,4,opt);
    if (local_78.refcount == (int *)0x0) goto LAB_004353e8;
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount != 0) goto LAB_004353e8;
    if (local_78.allocator != (Allocator *)0x0) {
      (*(local_78.allocator)->_vptr_Allocator[3])();
      goto LAB_004353e8;
    }
  }
  else {
    if (cVar11 != '\b') goto LAB_004353e8;
    Mat::reshape(&local_78,&local_c8,_w,_h,(Allocator *)0x0);
    convert_packing(&local_78,&this->weight_data_tm,8,opt);
    if (local_78.refcount == (int *)0x0) goto LAB_004353e8;
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount != 0) goto LAB_004353e8;
    if (local_78.allocator != (Allocator *)0x0) {
      (*(local_78.allocator)->_vptr_Allocator[3])();
      goto LAB_004353e8;
    }
  }
  if (local_78.data != (void *)0x0) {
    free(local_78.data);
  }
LAB_004353e8:
  piVar3 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_c8.data != (Allocator *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise_x86_avx::create_pipeline(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < (channels / group) * (num_output / group) * group; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            weight_data_tm = weight_data_transposed;
        }

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}